

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O2

planck_unit_result_t
planck_unit_assert_true(planck_unit_test_t *state,int condition,int line,char *file,char *message)

{
  planck_unit_result_t pVar1;
  
  if (condition == 0) {
    pVar1 = '\0';
  }
  else {
    if (state->allocated_message == '\x01') {
      free(message);
    }
    state->allocated_message = '\0';
    message = "";
    line = -1;
    pVar1 = '\x01';
  }
  state->result = pVar1;
  state->line = line;
  state->file = file;
  state->message = message;
  return pVar1;
}

Assistant:

planck_unit_result_t
planck_unit_assert_true(
	planck_unit_test_t	*state,
	int					condition,
	int					line,
	const char			*file,
	char				*message
) {
	if (condition) {
		/* Do this now, since message pointer gets replaced */
		if (1 == state->allocated_message) {
			free(message);
		}

		line						= -1;
/*		file						= ""; */
/*		func						= ""; */
		message						= "";
		/* Message has been freed or replaced, and is no longer allocated */
		state->allocated_message	= 0;
		state->result				= PLANCK_UNIT_SUCCESS;
	}
	else {
		state->result = PLANCK_UNIT_FAILURE;
	}

	state->line			= line;
	state->file			= file;
	state->message		= message;

	return state->result;
}